

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::ExpandPaths(cmFindBase *this)

{
  if ((this->super_cmFindCommon).NoDefaultPath == false) {
    if ((this->super_cmFindCommon).NoPackageRootPath == false) {
      FillPackageRootPath(this);
    }
    if ((this->super_cmFindCommon).NoCMakePath == false) {
      FillCMakeVariablePath(this);
    }
    if ((this->super_cmFindCommon).NoCMakeEnvironmentPath == false) {
      FillCMakeEnvironmentPath(this);
    }
  }
  FillUserHintsPath(this);
  if ((this->super_cmFindCommon).NoDefaultPath == false) {
    if ((this->super_cmFindCommon).NoSystemEnvironmentPath == false) {
      FillSystemEnvironmentPath(this);
    }
    if ((this->super_cmFindCommon).NoCMakeSystemPath == false) {
      FillCMakeSystemVariablePath(this);
    }
  }
  FillUserGuessPath(this);
  return;
}

Assistant:

void cmFindBase::ExpandPaths()
{
  if (!this->NoDefaultPath) {
    if (!this->NoPackageRootPath) {
      this->FillPackageRootPath();
    }
    if (!this->NoCMakePath) {
      this->FillCMakeVariablePath();
    }
    if (!this->NoCMakeEnvironmentPath) {
      this->FillCMakeEnvironmentPath();
    }
  }
  this->FillUserHintsPath();
  if (!this->NoDefaultPath) {
    if (!this->NoSystemEnvironmentPath) {
      this->FillSystemEnvironmentPath();
    }
    if (!this->NoCMakeSystemPath) {
      this->FillCMakeSystemVariablePath();
    }
  }
  this->FillUserGuessPath();
}